

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueExampleHugepages.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *this;
  thread t;
  SPSCQueue<int,_Allocator<int>_> q;
  int local_1ec;
  type local_1e8;
  thread local_1e0 [3];
  Allocator<int> local_1c1;
  SPSCQueue<int,_Allocator<int>_> local_1c0;
  int local_54;
  
  local_54 = 0;
  rigtorp::SPSCQueue<int,_Allocator<int>_>::SPSCQueue(&local_1c0,2,&local_1c1);
  sVar1 = rigtorp::SPSCQueue<int,_Allocator<int>_>::capacity(&local_1c0);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  local_1e8.q = &local_1c0;
  std::thread::thread<main::__0,,void>(local_1e0,&local_1e8);
  local_1ec = 1;
  rigtorp::SPSCQueue<int,Allocator<int>>::push<int,void>
            ((SPSCQueue<int,Allocator<int>> *)&local_1c0,&local_1ec);
  std::thread::join();
  local_54 = 0;
  std::thread::~thread(local_1e0);
  rigtorp::SPSCQueue<int,_Allocator<int>_>::~SPSCQueue(&local_1c0);
  return local_54;
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  SPSCQueue<int, Allocator<int>> q(2);
  std::cout << q.capacity() << std::endl;
  auto t = std::thread([&] {
    while (!q.front())
      ;
    std::cout << *q.front() << std::endl;
    q.pop();
  });
  q.push(1);
  t.join();

  return 0;
}